

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.cpp
# Opt level: O3

bool __thiscall ThreadPool::empty(ThreadPool *this)

{
  _List_node_base *p_Var1;
  int iVar2;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->_taskInfo);
  if (iVar2 == 0) {
    p_Var1 = (this->_task).
             super__List_base<AbstractTaskProvider_*,_std::allocator<AbstractTaskProvider_*>_>.
             _M_impl._M_node.super__List_node_base._M_next;
    pthread_mutex_unlock((pthread_mutex_t *)&this->_taskInfo);
    return p_Var1 == (_List_node_base *)&this->_task;
  }
  std::__throw_system_error(iVar2);
}

Assistant:

bool ThreadPool::empty()
{
    _taskInfo.lock();

    const bool emp = _task.empty();

    _taskInfo.unlock();

    return emp;
}